

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall
CTcParser::parse_superclass_list(CTcParser *this,CTcSymObj *obj_sym,CTPNSuperclassList *sclist)

{
  undefined1 *puVar1;
  char *pcVar2;
  size_t sVar3;
  CTcTokenizer *pCVar4;
  int iVar5;
  tc_toktyp_t tVar6;
  CTcSymObjBase *this_00;
  CTPNSuperclass *pCVar7;
  CTcSymObj *sym;
  
  do {
    pCVar4 = G_tok;
    tVar6 = (G_tok->curtok_).typ_;
    if (tVar6 != TOKT_SYM) {
      if (tVar6 == TOKT_OBJECT) {
        if (sclist->head_ != (CTPNSuperclass *)0x0) {
          CTcTokenizer::log_error(0x2b5f);
        }
        if (obj_sym != (CTcSymObj *)0x0) {
          puVar1 = &(obj_sym->super_CTcSymObjBase).field_0xb9;
          *puVar1 = *puVar1 | 4;
        }
        CTcTokenizer::next(G_tok);
        return;
      }
      CTcTokenizer::log_error_curtok(G_tok,0x2b5e);
      return;
    }
    sym = (CTcSymObj *)(G_tok->curtok_).text_;
    this_00 = (CTcSymObjBase *)
              CTcPrsSymtab::find(this->global_symtab_,(textchar_t *)sym,(G_tok->curtok_).text_len_,
                                 (CTcPrsSymtab **)0x0);
    if (((obj_sym == (CTcSymObj *)0x0) || (this_00 == (CTcSymObjBase *)0x0)) ||
       (*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                 super_CVmHashEntry.field_0x24 != 2)) {
LAB_00203d0b:
      pCVar7 = (CTPNSuperclass *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)sym);
      pcVar2 = (pCVar4->curtok_).text_;
      sVar3 = (pCVar4->curtok_).text_len_;
      (pCVar7->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_00311e20;
      pCVar7->sym_txt_ = pcVar2;
      pCVar7->sym_len_ = sVar3;
      pCVar7->nxt_ = (CTPNSuperclass *)0x0;
      pCVar7->prv_ = (CTPNSuperclass *)0x0;
      pCVar7->sym_ = (CTcSymbol *)0x0;
      *sclist->dst_ = pCVar7;
      sclist->dst_ = &pCVar7->nxt_;
      pCVar7->nxt_ = (CTPNSuperclass *)0x0;
      pCVar7->prv_ = sclist->tail_;
      sclist->tail_ = pCVar7;
      if (obj_sym != (CTcSymObj *)0x0) {
        CTcSymObjBase::add_sc_name_entry
                  (&obj_sym->super_CTcSymObjBase,(pCVar4->curtok_).text_,(pCVar4->curtok_).text_len_
                  );
      }
    }
    else {
      if (this_00 != &obj_sym->super_CTcSymObjBase) {
        sym = obj_sym;
        iVar5 = CTcSymObjBase::has_superclass(this_00,obj_sym);
        if (iVar5 == 0) goto LAB_00203d0b;
      }
      CTcTokenizer::log_error
                (0x2bbb,(ulong)(uint)(this_00->super_CTcSymbol).super_CTcSymbolBase.
                                     super_CVmHashEntryCS.super_CVmHashEntry.len_,
                 (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                 super_CVmHashEntry.str_,
                 (ulong)(uint)(obj_sym->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.
                              super_CVmHashEntryCS.super_CVmHashEntry.len_,
                 (obj_sym->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.str_);
    }
    tVar6 = CTcTokenizer::next(G_tok);
    if (tVar6 != TOKT_COMMA) {
      return;
    }
    CTcTokenizer::next(G_tok);
  } while( true );
}

Assistant:

void CTcParser::parse_superclass_list(
    CTcSymObj *obj_sym, CTPNSuperclassList &sclist)
{
    /* scan the list */
    for (int done = FALSE ; !done ; )
    {
        /* we need a symbol */
        switch(G_tok->cur())
        {
        case TOKT_SYM:
            /* a symbol must be a superclass name - look it up */
            {
                const CTcToken *tok = G_tok->getcur();
                CTcSymObj *sc_sym = (CTcSymObj *)get_global_symtab()->find(
                    tok->get_text(), tok->get_text_len());

                /* 
                 *   If this symbol is defined, and it's an object, check to
                 *   make sure this won't set up a circular class definition
                 *   - so, make sure the base class isn't the same as the
                 *   object being defined, and that it doesn't inherit from
                 *   the object being defined.  
                 */
                if (sc_sym != 0
                    && obj_sym != 0
                    && sc_sym->get_type() == TC_SYM_OBJ
                    && (sc_sym == obj_sym || sc_sym->has_superclass(obj_sym)))
                {
                    /* 
                     *   this is a circular class definition - complain about
                     *   it and don't add it to my superclass list 
                     */
                    G_tok->log_error(TCERR_CIRCULAR_CLASS_DEF,
                                     (int)sc_sym->get_sym_len(),
                                     sc_sym->get_sym(),
                                     (int)obj_sym->get_sym_len(),
                                     obj_sym->get_sym());
                }
                else
                {
                    /* it's good - add the new superclass to our list */
                    sclist.append(new CTPNSuperclass(
                        tok->get_text(), tok->get_text_len()));
                    
                    /* 
                     *   add it to the symbol's superclass name list as well
                     *   - we use this for keeping track of the hierarchy in
                     *   the symbol file for compile-time access 
                     */
                    if (obj_sym != 0)
                        obj_sym->add_sc_name_entry(
                            tok->get_text(), tok->get_text_len());
                }
                
                /* skip the symbol and see what follows */
                switch (G_tok->next())
                {
                case TOKT_COMMA:
                    /* we have another superclass following */
                    G_tok->next();
                    break;
                    
                default:
                    /* no more superclasses */
                    done = TRUE;
                    break;
                }
            }
            break;

        case TOKT_OBJECT:
            /* 
             *   it's a basic object definition - make sure other
             *   superclasses weren't specified 
             */
            if (sclist.head_ != 0)
                G_tok->log_error(TCERR_OBJDEF_OBJ_NO_SC);
            
            /* 
             *   mark the object as having an explicit superclass of the root
             *   object class 
             */
            if (obj_sym != 0)
                obj_sym->set_sc_is_root(TRUE);
            
            /* 
             *   skip the 'object' keyword and we're done - there's no
             *   superclass list 
             */
            G_tok->next();
            done = TRUE;
            break;
            
        default:
            /* premature end of the object list */
            G_tok->log_error_curtok(TCERR_OBJDEF_REQ_SC);
            
            /* stop here */
            done = TRUE;
            break;
        }
    }
}